

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

char * canonical_charset_name(char *charset)

{
  long lVar1;
  size_t sVar2;
  int *piVar3;
  int *piVar4;
  char *pcVar5;
  char cVar6;
  char cVar7;
  char cs [16];
  int local_18;
  char cStack_14;
  undefined1 uStack_13;
  undefined2 uStack_12;
  char local_10;
  
  piVar3 = &local_18;
  pcVar5 = charset;
  if (((charset != (char *)0x0) && (*charset != '\0')) && (sVar2 = strlen(charset), sVar2 < 0x10)) {
    cVar6 = *charset;
    piVar4 = &local_18;
    if (cVar6 != '\0') {
      pcVar5 = charset + 1;
      do {
        cVar7 = cVar6 + -0x20;
        if (0x19 < (byte)(cVar6 + 0x9fU)) {
          cVar7 = cVar6;
        }
        *(char *)piVar3 = cVar7;
        piVar3 = (int *)((long)piVar3 + 1);
        cVar6 = *pcVar5;
        pcVar5 = pcVar5 + 1;
        piVar4 = piVar3;
      } while (cVar6 != '\0');
    }
    *(char *)piVar4 = '\0';
    pcVar5 = "UTF-8";
    if ((CONCAT11(uStack_13,cStack_14) != 0x38 || local_18 != 0x2d465455) &&
       (cStack_14 != '\0' || local_18 != 0x38465455)) {
      lVar1 = CONCAT26(uStack_12,CONCAT15(uStack_13,CONCAT14(cStack_14,local_18)));
      if (lVar1 == 0x45423631465455 || local_10 == '\0' && lVar1 == 0x454236312d465455) {
        pcVar5 = "UTF-16BE";
      }
      else if (lVar1 == 0x454c3631465455 ||
               local_10 == '\0' &&
               CONCAT26(uStack_12,CONCAT15(uStack_13,CONCAT14(cStack_14,local_18))) ==
               0x454c36312d465455) {
        pcVar5 = "UTF-16LE";
      }
      else {
        pcVar5 = charset;
        if (CONCAT11(uStack_13,cStack_14) == 0x32 && local_18 == 0x33395043) {
          pcVar5 = "CP932";
        }
      }
    }
  }
  return pcVar5;
}

Assistant:

static const char *
canonical_charset_name(const char *charset)
{
	char cs[16];
	char *p;
	const char *s;

	if (charset == NULL || charset[0] == '\0'
	    || strlen(charset) > 15)
		return (charset);

	/* Copy name to uppercase. */
	p = cs;
	s = charset;
	while (*s) {
		char c = *s++;
		if (c >= 'a' && c <= 'z')
			c -= 'a' - 'A';
		*p++ = c;
	}
	*p++ = '\0';

	if (strcmp(cs, "UTF-8") == 0 ||
	    strcmp(cs, "UTF8") == 0)
		return ("UTF-8");
	if (strcmp(cs, "UTF-16BE") == 0 ||
	    strcmp(cs, "UTF16BE") == 0)
		return ("UTF-16BE");
	if (strcmp(cs, "UTF-16LE") == 0 ||
	    strcmp(cs, "UTF16LE") == 0)
		return ("UTF-16LE");
	if (strcmp(cs, "CP932") == 0)
		return ("CP932");
	return (charset);
}